

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnView::setColumnWidths(QColumnView *this,QList<int> *list)

{
  QColumnViewPrivate *pQVar1;
  qsizetype qVar2;
  Promoted<int,_long_long> PVar3;
  const_reference ppQVar4;
  const_reference piVar5;
  reference piVar6;
  QList<int> *in_RSI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000018;
  int count;
  int i;
  QColumnViewPrivate *d;
  int listCount;
  undefined4 in_stack_ffffffffffffffa8;
  parameter_type in_stack_ffffffffffffffac;
  QList<QAbstractItemView_*> *in_stack_ffffffffffffffb0;
  QAbstractItemView *pQVar7;
  int iVar8;
  int in_stack_ffffffffffffffc4;
  int local_34;
  qsizetype local_18;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QColumnView *)0x86533a);
  local_34 = 0;
  qVar2 = QList<int>::size(in_RSI);
  local_c = (int)qVar2;
  local_18 = QList<QAbstractItemView_*>::size(&pQVar1->columns);
  PVar3 = qMin<int,long_long>(&local_c,&local_18);
  for (; local_34 < (int)PVar3; local_34 = local_34 + 1) {
    ppQVar4 = QList<QAbstractItemView_*>::at
                        (in_stack_ffffffffffffffb0,
                         CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    pQVar7 = *ppQVar4;
    piVar5 = QList<int>::at((QList<int> *)in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar8 = *piVar5;
    QList<QAbstractItemView_*>::at
              (in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QWidget::height((QWidget *)0x8653dd);
    QWidget::resize((QWidget *)CONCAT44(in_stack_ffffffffffffffc4,iVar8),
                    (int)((ulong)pQVar7 >> 0x20),(int)pQVar7);
    piVar5 = QList<int>::at((QList<int> *)in_stack_ffffffffffffffb0,
                            CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    in_stack_ffffffffffffffc4 = *piVar5;
    piVar6 = QList<int>::operator[]
                       ((QList<int> *)in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *piVar6 = in_stack_ffffffffffffffc4;
  }
  QList<int>::reserve(in_RSI,in_stack_00000018);
  for (; local_34 < local_c; local_34 = local_34 + 1) {
    QList<int>::at(&pQVar1->columnSizes,
                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    QList<int>::append((QList<int> *)0x865479,in_stack_ffffffffffffffac);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::setColumnWidths(const QList<int> &list)
{
    Q_D(QColumnView);
    int i = 0;
    const int listCount = list.size();
    const int count = qMin(listCount, d->columns.size());
    for (; i < count; ++i) {
        d->columns.at(i)->resize(list.at(i), d->columns.at(i)->height());
        d->columnSizes[i] = list.at(i);
    }

    d->columnSizes.reserve(listCount);
    for (; i < listCount; ++i)
        d->columnSizes.append(list.at(i));
}